

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O2

void initRustData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  initializer_list<std::pair<char,_QLatin1String>_> list_02;
  QMultiHash<char,_QLatin1String> QStack_4f8;
  pair<char,_QLatin1String> local_4e8;
  undefined1 local_4d0;
  undefined8 local_4c8;
  char *local_4c0;
  undefined1 local_4b8;
  undefined8 local_4b0;
  char *local_4a8;
  undefined1 local_4a0;
  undefined8 local_498;
  char *local_490;
  undefined1 local_488;
  undefined8 local_480;
  char *local_478;
  undefined1 local_470;
  undefined8 local_468;
  char *local_460;
  undefined1 local_458;
  undefined8 local_450;
  char *local_448;
  undefined1 local_440;
  undefined8 local_438;
  char *local_430;
  undefined1 local_428;
  undefined8 local_420;
  char *local_418;
  undefined1 local_410;
  undefined8 local_408;
  char *local_400;
  undefined1 local_3f8;
  undefined8 local_3f0;
  char *local_3e8;
  undefined1 local_3e0;
  undefined8 local_3d8;
  char *local_3d0;
  undefined1 local_3c8;
  undefined8 local_3c0;
  char *local_3b8;
  undefined1 local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  undefined1 local_398;
  undefined8 local_390;
  char *local_388;
  undefined1 local_380;
  undefined8 local_378;
  char *local_370;
  undefined1 local_368;
  undefined8 local_360;
  char *local_358;
  undefined1 local_350;
  undefined8 local_348;
  char *local_340;
  undefined1 local_338;
  undefined8 local_330;
  char *local_328;
  undefined1 local_320;
  undefined8 local_318;
  char *local_310;
  undefined1 local_308;
  undefined8 local_300;
  char *local_2f8;
  undefined1 local_2f0;
  undefined8 local_2e8;
  char *local_2e0;
  undefined1 local_2d8;
  undefined8 local_2d0;
  char *local_2c8;
  undefined1 local_2c0;
  undefined8 local_2b8;
  char *local_2b0;
  undefined1 local_2a8;
  undefined8 local_2a0;
  char *local_298;
  undefined1 local_290;
  undefined8 local_288;
  char *local_280;
  undefined1 local_278;
  undefined8 local_270;
  char *local_268;
  undefined1 local_260;
  undefined8 local_258;
  char *local_250;
  undefined1 local_248;
  undefined8 local_240;
  char *local_238;
  undefined1 local_230;
  undefined8 local_228;
  char *local_220;
  undefined1 local_218;
  undefined8 local_210;
  char *local_208;
  undefined1 local_200;
  undefined8 local_1f8;
  char *local_1f0;
  undefined1 local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  undefined1 local_1d0;
  undefined8 local_1c8;
  char *local_1c0;
  undefined1 local_1b8;
  undefined8 local_1b0;
  char *local_1a8;
  undefined1 local_1a0;
  undefined8 local_198;
  char *local_190;
  undefined1 local_188;
  undefined8 local_180;
  char *local_178;
  undefined1 local_170;
  undefined8 local_168;
  char *local_160;
  undefined1 local_158;
  undefined8 local_150;
  char *local_148;
  undefined1 local_140;
  undefined8 local_138;
  char *local_130;
  undefined1 local_128;
  undefined8 local_120;
  char *local_118;
  undefined1 local_110;
  undefined8 local_108;
  char *local_100;
  undefined1 local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined1 local_e0;
  undefined8 local_d8;
  char *local_d0;
  undefined1 local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined1 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined1 local_98;
  undefined8 local_90;
  char *local_88;
  undefined1 local_80;
  undefined8 local_78;
  char *local_70;
  undefined1 local_68;
  undefined8 local_60;
  char *local_58;
  undefined1 local_50;
  undefined8 local_48;
  char *local_40;
  
  local_4e8.first = 'a';
  local_4e8.second.m_size = 8;
  local_4e8.second.m_data = "abstract";
  local_4d0 = 0x61;
  local_4c8 = 7;
  local_4c0 = "alignof";
  local_4b8 = 0x61;
  local_4b0 = 2;
  local_4a8 = "as";
  local_4a0 = 0x61;
  local_498 = 5;
  local_490 = "async";
  local_488 = 0x61;
  local_480 = 5;
  local_478 = "await";
  local_470 = 0x62;
  local_468 = 2;
  local_460 = "be";
  local_458 = 0x62;
  local_450 = 3;
  local_448 = "box";
  local_440 = 0x62;
  local_438 = 5;
  local_430 = "break";
  local_428 = 99;
  local_420 = 5;
  local_418 = "const";
  local_410 = 99;
  local_408 = 8;
  local_400 = "continue";
  local_3f8 = 99;
  local_3f0 = 5;
  local_3e8 = "crate";
  local_3e0 = 100;
  local_3d8 = 2;
  local_3d0 = "do";
  local_3c8 = 100;
  local_3c0 = 3;
  local_3b8 = "dyn";
  local_3b0 = 0x65;
  local_3a8 = 4;
  local_3a0 = "else";
  local_398 = 0x65;
  local_390 = 6;
  local_388 = "extern";
  local_380 = 0x66;
  local_378 = 5;
  local_370 = "final";
  local_368 = 0x66;
  local_360 = 2;
  local_358 = "fn";
  local_350 = 0x66;
  local_348 = 3;
  local_340 = "for";
  local_338 = 0x69;
  local_330 = 2;
  local_328 = "if";
  local_320 = 0x69;
  local_318 = 4;
  local_310 = "impl";
  local_308 = 0x69;
  local_300 = 2;
  local_2f8 = "in";
  local_2f0 = 0x6c;
  local_2e8 = 3;
  local_2e0 = "let";
  local_2d8 = 0x6c;
  local_2d0 = 4;
  local_2c8 = "loop";
  local_2c0 = 0x6d;
  local_2b8 = 5;
  local_2b0 = "match";
  local_2a8 = 0x6d;
  local_2a0 = 3;
  local_298 = "mod";
  local_290 = 0x6d;
  local_288 = 4;
  local_280 = "move";
  local_278 = 0x6d;
  local_270 = 3;
  local_268 = "mut";
  local_260 = 0x6f;
  local_258 = 8;
  local_250 = "offsetof";
  local_248 = 0x6f;
  local_240 = 4;
  local_238 = "once";
  local_230 = 0x6f;
  local_228 = 8;
  local_220 = "override";
  local_218 = 0x70;
  local_210 = 4;
  local_208 = "priv";
  local_200 = 0x70;
  local_1f8 = 3;
  local_1f0 = "pub";
  local_1e8 = 0x70;
  local_1e0 = 4;
  local_1d8 = "pure";
  local_1d0 = 0x72;
  local_1c8 = 3;
  local_1c0 = "ref";
  local_1b8 = 0x72;
  local_1b0 = 6;
  local_1a8 = "return";
  local_1a0 = 0x73;
  local_198 = 6;
  local_190 = "sizeof";
  local_188 = 0x73;
  local_180 = 6;
  local_178 = "static";
  local_170 = 0x73;
  local_168 = 4;
  local_160 = "self";
  local_158 = 0x53;
  local_150 = 4;
  local_148 = "Self";
  local_140 = 0x73;
  local_138 = 5;
  local_130 = "super";
  local_128 = 0x74;
  local_120 = 5;
  local_118 = "trait";
  local_110 = 0x74;
  local_108 = 4;
  local_100 = "type";
  local_f8 = 0x74;
  local_f0 = 6;
  local_e8 = "typeof";
  local_e0 = 0x75;
  local_d8 = 6;
  local_d0 = "unsafe";
  local_c8 = 0x75;
  local_c0 = 7;
  local_b8 = "unsized";
  local_b0 = 0x75;
  local_a8 = 3;
  local_a0 = "use";
  local_98 = 0x76;
  local_90 = 7;
  local_88 = "virtual";
  local_80 = 0x77;
  local_78 = 5;
  local_70 = "where";
  local_68 = 0x77;
  local_60 = 5;
  local_58 = "while";
  local_50 = 0x79;
  local_48 = 5;
  local_40 = "yield";
  list._M_len = 0x32;
  list._M_array = &local_4e8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_4f8,list);
  QMultiHash<char,_QLatin1String>::operator=(&rust_keywords,&QStack_4f8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_4f8);
  local_4e8.first = 'u';
  local_4e8.second.m_size = 5;
  local_4e8.second.m_data = "union";
  local_4d0 = 0x65;
  local_4c8 = 4;
  local_4c0 = "enum";
  local_4b8 = 0x73;
  local_4b0 = 6;
  local_4a8 = "struct";
  local_4a0 = 0x69;
  local_498 = 2;
  local_490 = "i8";
  local_488 = 0x69;
  local_480 = 3;
  local_478 = "i16";
  local_470 = 0x69;
  local_468 = 3;
  local_460 = "i32";
  local_458 = 0x69;
  local_450 = 3;
  local_448 = "i64";
  local_440 = 0x69;
  local_438 = 4;
  local_430 = "i128";
  local_428 = 0x69;
  local_420 = 5;
  local_418 = "isize";
  local_410 = 0x75;
  local_408 = 2;
  local_400 = "u8";
  local_3f8 = 0x75;
  local_3f0 = 3;
  local_3e8 = "u16";
  local_3e0 = 0x75;
  local_3d8 = 3;
  local_3d0 = "u32";
  local_3c8 = 0x75;
  local_3c0 = 3;
  local_3b8 = "u64";
  local_3b0 = 0x75;
  local_3a8 = 4;
  local_3a0 = "u128";
  local_398 = 0x75;
  local_390 = 5;
  local_388 = "usize";
  local_380 = 0x66;
  local_378 = 3;
  local_370 = "f32";
  local_368 = 0x66;
  local_360 = 3;
  local_358 = "f64";
  local_350 = 0x73;
  local_348 = 3;
  local_340 = "str";
  local_338 = 99;
  local_330 = 4;
  local_328 = "char";
  local_320 = 0x62;
  local_318 = 4;
  local_310 = "bool";
  local_308 = 0x42;
  local_300 = 3;
  local_2f8 = "Box";
  local_2f0 = 0x4f;
  local_2e8 = 6;
  local_2e0 = "Option";
  local_2d8 = 0x52;
  local_2d0 = 6;
  local_2c8 = "Result";
  local_2c0 = 0x53;
  local_2b8 = 6;
  local_2b0 = "String";
  local_2a8 = 0x56;
  local_2a0 = 3;
  local_298 = "Vec";
  list_00._M_len = 0x19;
  list_00._M_array = &local_4e8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_4f8,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&rust_types,&QStack_4f8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_4f8);
  local_4e8.first = 'f';
  local_4e8.second.m_size = 5;
  local_4e8.second.m_data = "false";
  local_4d0 = 0x74;
  local_4c8 = 4;
  local_4c0 = "true";
  list_01._M_len = 2;
  list_01._M_array = &local_4e8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_4f8,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&rust_literals,&QStack_4f8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_4f8);
  local_4e8.first = '\0';
  local_4e8._1_7_ = 0;
  local_4e8.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&rust_builtin,(QMultiHash<char,_QLatin1String> *)&local_4e8);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_4e8);
  local_4e8.first = 'a';
  local_4e8.second.m_size = 7;
  local_4e8.second.m_data = "assert!";
  local_4d0 = 0x61;
  local_4c8 = 10;
  local_4c0 = "assert_eq!";
  local_4b8 = 0x62;
  local_4b0 = 9;
  local_4a8 = "bitflags!";
  local_4a0 = 0x62;
  local_498 = 6;
  local_490 = "bytes!";
  local_488 = 99;
  local_480 = 4;
  local_478 = "cfg!";
  local_470 = 99;
  local_468 = 4;
  local_460 = "col!";
  local_458 = 99;
  local_450 = 7;
  local_448 = "concat!";
  local_440 = 99;
  local_438 = 0xe;
  local_430 = "concat_idents!";
  local_428 = 100;
  local_420 = 0xd;
  local_418 = "debug_assert!";
  local_410 = 100;
  local_408 = 0x10;
  local_400 = "debug_assert_eq!";
  local_3f8 = 0x65;
  local_3f0 = 4;
  local_3e8 = "env!";
  local_3e0 = 0x70;
  local_3d8 = 6;
  local_3d0 = "panic!";
  local_3c8 = 0x66;
  local_3c0 = 5;
  local_3b8 = "file!";
  local_3b0 = 0x66;
  local_3a8 = 7;
  local_3a0 = "format!";
  local_398 = 0x66;
  local_390 = 0xc;
  local_388 = "format_args!";
  local_380 = 0x69;
  local_378 = 0xc;
  local_370 = "include_bin!";
  local_368 = 0x69;
  local_360 = 0xc;
  local_358 = "include_str!";
  local_350 = 0x6c;
  local_348 = 5;
  local_340 = "line!";
  local_338 = 0x6c;
  local_330 = 0xf;
  local_328 = "local_data_key!";
  local_320 = 0x6d;
  local_318 = 0xc;
  local_310 = "module_path!";
  local_308 = 0x6f;
  local_300 = 0xb;
  local_2f8 = "option_env!";
  local_2f0 = 0x70;
  local_2e8 = 6;
  local_2e0 = "print!";
  local_2d8 = 0x70;
  local_2d0 = 8;
  local_2c8 = "println!";
  local_2c0 = 0x73;
  local_2b8 = 7;
  local_2b0 = "select!";
  local_2a8 = 0x73;
  local_2a0 = 10;
  local_298 = "stringify!";
  local_290 = 0x74;
  local_288 = 4;
  local_280 = "try!";
  local_278 = 0x75;
  local_270 = 0xe;
  local_268 = "unimplemented!";
  local_260 = 0x75;
  local_258 = 0xc;
  local_250 = "unreachable!";
  local_248 = 0x76;
  local_240 = 4;
  local_238 = "vec!";
  local_230 = 0x77;
  local_228 = 6;
  local_220 = "write!";
  local_218 = 0x77;
  local_210 = 8;
  local_208 = "writeln!";
  local_200 = 0x6d;
  local_1f8 = 0xc;
  local_1f0 = "macro_rules!";
  local_1e8 = 0x61;
  local_1e0 = 10;
  local_1d8 = "assert_ne!";
  local_1d0 = 100;
  local_1c8 = 0x10;
  local_1c0 = "debug_assert_ne!";
  list_02._M_len = 0x22;
  list_02._M_array = &local_4e8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_4f8,list_02);
  QMultiHash<char,_QLatin1String>::operator=(&rust_other,&QStack_4f8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_4f8);
  return;
}

Assistant:

void initRustData() {
    rust_keywords = {
        {('a'), QLatin1String("abstract")}, {('a'), QLatin1String("alignof")},
        {('a'), QLatin1String("as")},       {('a'), QLatin1String("async")},
        {('a'), QLatin1String("await")},    {('b'), QLatin1String("be")},
        {('b'), QLatin1String("box")},      {('b'), QLatin1String("break")},
        {('c'), QLatin1String("const")},    {('c'), QLatin1String("continue")},
        {('c'), QLatin1String("crate")},    {('d'), QLatin1String("do")},
        {('d'), QLatin1String("dyn")},      {('e'), QLatin1String("else")},
        {('e'), QLatin1String("extern")},   {('f'), QLatin1String("final")},
        {('f'), QLatin1String("fn")},       {('f'), QLatin1String("for")},
        {('i'), QLatin1String("if")},       {('i'), QLatin1String("impl")},
        {('i'), QLatin1String("in")},       {('l'), QLatin1String("let")},
        {('l'), QLatin1String("loop")},     {('m'), QLatin1String("match")},
        {('m'), QLatin1String("mod")},      {('m'), QLatin1String("move")},
        {('m'), QLatin1String("mut")},      {('o'), QLatin1String("offsetof")},
        {('o'), QLatin1String("once")},     {('o'), QLatin1String("override")},
        {('p'), QLatin1String("priv")},     {('p'), QLatin1String("pub")},
        {('p'), QLatin1String("pure")},     {('r'), QLatin1String("ref")},
        {('r'), QLatin1String("return")},   {('s'), QLatin1String("sizeof")},
        {('s'), QLatin1String("static")},   {('s'), QLatin1String("self")},
        {('S'), QLatin1String("Self")},     {('s'), QLatin1String("super")},
        {('t'), QLatin1String("trait")},    {('t'), QLatin1String("type")},
        {('t'), QLatin1String("typeof")},   {('u'), QLatin1String("unsafe")},
        {('u'), QLatin1String("unsized")},  {('u'), QLatin1String("use")},
        {('v'), QLatin1String("virtual")},  {('w'), QLatin1String("where")},
        {('w'), QLatin1String("while")},    {('y'), QLatin1String("yield")},
    };

    rust_types = {
        {('u'), QLatin1String("union")},  {('e'), QLatin1String("enum")},
        {('s'), QLatin1String("struct")},

        {('i'), QLatin1String("i8")},     {('i'), QLatin1String("i16")},
        {('i'), QLatin1String("i32")},    {('i'), QLatin1String("i64")},
        {('i'), QLatin1String("i128")},   {('i'), QLatin1String("isize")},
        {('u'), QLatin1String("u8")},     {('u'), QLatin1String("u16")},
        {('u'), QLatin1String("u32")},    {('u'), QLatin1String("u64")},
        {('u'), QLatin1String("u128")},   {('u'), QLatin1String("usize")},
        {('f'), QLatin1String("f32")},    {('f'), QLatin1String("f64")},
        {('s'), QLatin1String("str")},    {('c'), QLatin1String("char")},
        {('b'), QLatin1String("bool")},   {('B'), QLatin1String("Box")},
        {('O'), QLatin1String("Option")}, {('R'), QLatin1String("Result")},
        {('S'), QLatin1String("String")}, {('V'), QLatin1String("Vec")}};

    rust_literals = {{('f'), QLatin1String("false")},
                     {('t'), QLatin1String("true")}};

    rust_builtin = {

    };

    rust_other = {{('a'), QLatin1String("assert!")},
                  {('a'), QLatin1String("assert_eq!")},
                  {('b'), QLatin1String("bitflags!")},
                  {('b'), QLatin1String("bytes!")},
                  {('c'), QLatin1String("cfg!")},
                  {('c'), QLatin1String("col!")},
                  {('c'), QLatin1String("concat!")},
                  {('c'), QLatin1String("concat_idents!")},
                  {('d'), QLatin1String("debug_assert!")},
                  {('d'), QLatin1String("debug_assert_eq!")},
                  {('e'), QLatin1String("env!")},
                  {('p'), QLatin1String("panic!")},
                  {('f'), QLatin1String("file!")},
                  {('f'), QLatin1String("format!")},
                  {('f'), QLatin1String("format_args!")},
                  {('i'), QLatin1String("include_bin!")},
                  {('i'), QLatin1String("include_str!")},
                  {('l'), QLatin1String("line!")},
                  {('l'), QLatin1String("local_data_key!")},
                  {('m'), QLatin1String("module_path!")},
                  {('o'), QLatin1String("option_env!")},
                  {('p'), QLatin1String("print!")},
                  {('p'), QLatin1String("println!")},
                  {('s'), QLatin1String("select!")},
                  {('s'), QLatin1String("stringify!")},
                  {('t'), QLatin1String("try!")},
                  {('u'), QLatin1String("unimplemented!")},
                  {('u'), QLatin1String("unreachable!")},
                  {('v'), QLatin1String("vec!")},
                  {('w'), QLatin1String("write!")},
                  {('w'), QLatin1String("writeln!")},
                  {('m'), QLatin1String("macro_rules!")},
                  {('a'), QLatin1String("assert_ne!")},
                  {('d'), QLatin1String("debug_assert_ne!")}};
}